

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O0

void ODDLParser::logMessage(LogSeverity severity,string *msg)

{
  string local_38 [8];
  string log;
  string *msg_local;
  LogSeverity severity_local;
  
  log.field_2._8_8_ = msg;
  std::__cxx11::string::string(local_38);
  if (severity == ddl_debug_msg) {
    std::__cxx11::string::operator+=(local_38,"Debug:");
  }
  else if (severity == ddl_info_msg) {
    std::__cxx11::string::operator+=(local_38,"Info :");
  }
  else if (severity == ddl_warn_msg) {
    std::__cxx11::string::operator+=(local_38,"Warn :");
  }
  else if (severity == ddl_error_msg) {
    std::__cxx11::string::operator+=(local_38,"Error:");
  }
  else {
    std::__cxx11::string::operator+=(local_38,"None :");
  }
  std::__cxx11::string::operator+=(local_38,(string *)log.field_2._8_8_);
  std::operator<<((ostream *)&std::cout,local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

static void logMessage( LogSeverity severity, const std::string &msg ) {
    std::string log;
    if( ddl_debug_msg == severity ) {
        log += "Debug:";
    } else if( ddl_info_msg == severity ) {
        log += "Info :";
    } else if( ddl_warn_msg == severity ) {
        log += "Warn :";
    } else if( ddl_error_msg == severity ) {
        log += "Error:";
    } else {
        log += "None :";
    }

    log += msg;
    std::cout << log;
}